

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  Vdbe *pVVar5;
  char *in_RCX;
  undefined8 in_RDX;
  char *pcVar6;
  sqlite3 *in_RDI;
  int in_R9D;
  undefined8 *in_stack_00000008;
  VdbeOp *aOp;
  int iDb;
  Vdbe *v;
  int j_1;
  int j;
  FKey *pFKey;
  Index *pIdx;
  char *zFault;
  Parse sParse;
  Incrblob *pBlob;
  Table *pTab;
  char *zErr;
  int rc;
  int iCol;
  int nAttempt;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd4;
  Parse *pParse;
  Vdbe *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  u32 in_stack_fffffffffffffdec;
  Vdbe *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  Vdbe *in_stack_fffffffffffffe00;
  FKey *pFVar7;
  sqlite3_int64 in_stack_fffffffffffffe08;
  Index *pIVar8;
  Incrblob *in_stack_fffffffffffffe10;
  undefined1 local_1e8 [8];
  char *local_1e0;
  int local_1b4;
  int local_1b0;
  Table *local_48;
  char *local_40;
  uint local_38;
  int local_34;
  int local_30;
  
  local_30 = 0;
  local_38 = 0;
  *in_stack_00000008 = 0;
  uVar2 = (uint)(in_R9D != 0);
  sqlite3_mutex_enter((sqlite3_mutex *)0x1377c8);
  pvVar4 = sqlite3DbMallocZero((sqlite3 *)
                               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  do {
    local_40 = (char *)0x0;
    memset(local_1e8,0,0x198);
    if (pvVar4 == (void *)0x0) break;
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                  (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_40 = (char *)0x0;
    sqlite3BtreeEnterAll((sqlite3 *)0x13783e);
    local_48 = sqlite3LocateTable((Parse *)CONCAT44(in_stack_fffffffffffffdfc,
                                                    in_stack_fffffffffffffdf8),
                                  (u32)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                                  (char *)CONCAT44(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8),
                                  (char *)in_stack_fffffffffffffde0);
    if ((local_48 != (Table *)0x0) && (local_48->nModuleArg != 0)) {
      local_48 = (Table *)0x0;
      sqlite3ErrorMsg((Parse *)local_1e8,"cannot open virtual table: %s",in_RDX);
    }
    if ((local_48 != (Table *)0x0) && ((local_48->tabFlags & 0x20) != 0)) {
      local_48 = (Table *)0x0;
      sqlite3ErrorMsg((Parse *)local_1e8,"cannot open table without rowid: %s",in_RDX);
    }
    if ((local_48 != (Table *)0x0) && (local_48->pSelect != (Select *)0x0)) {
      local_48 = (Table *)0x0;
      sqlite3ErrorMsg((Parse *)local_1e8,"cannot open view: %s",in_RDX);
    }
    if (local_48 == (Table *)0x0) {
      if (local_1e0 != (char *)0x0) {
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                      (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        local_40 = local_1e0;
        local_1e0 = (char *)0x0;
      }
      local_38 = 1;
      sqlite3BtreeLeaveAll((sqlite3 *)0x13797e);
      break;
    }
    *(Table **)((long)pvVar4 + 0x30) = local_48;
    pParse = (Parse *)in_RDI->aDb;
    iVar3 = sqlite3SchemaToIndex(in_RDI,local_48->pSchema);
    *(sqlite3 **)((long)pvVar4 + 0x28) = (&pParse->db)[(long)iVar3 * 4];
    local_34 = 0;
    while ((local_40 = (char *)0x0, local_34 < local_48->nCol &&
           (iVar3 = sqlite3StrICmp(local_48->aCol[local_34].zName,in_RCX), iVar3 != 0))) {
      local_34 = local_34 + 1;
    }
    if (local_34 == local_48->nCol) {
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                    (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      local_40 = sqlite3MPrintf(in_RDI,"no such column: \"%s\"",in_RCX);
      local_38 = 1;
      sqlite3BtreeLeaveAll((sqlite3 *)0x137ab4);
      break;
    }
    if (uVar2 != 0) {
      pcVar6 = (char *)0x0;
      if ((in_RDI->flags & 0x4000) != 0) {
        for (pFVar7 = local_48->pFKey; pFVar7 != (FKey *)0x0; pFVar7 = pFVar7->pNextFrom) {
          for (in_stack_fffffffffffffdfc = 0; in_stack_fffffffffffffdfc < pFVar7->nCol;
              in_stack_fffffffffffffdfc = in_stack_fffffffffffffdfc + 1) {
            if (pFVar7->aCol[in_stack_fffffffffffffdfc].iFrom == local_34) {
              pcVar6 = "foreign key";
            }
          }
        }
        in_stack_fffffffffffffe00 = (Vdbe *)0x0;
      }
      for (pIVar8 = local_48->pIndex; pIVar8 != (Index *)0x0; pIVar8 = pIVar8->pNext) {
        for (in_stack_fffffffffffffdf8 = 0; in_stack_fffffffffffffdf8 < (int)(uint)pIVar8->nKeyCol;
            in_stack_fffffffffffffdf8 = in_stack_fffffffffffffdf8 + 1) {
          if ((pIVar8->aiColumn[in_stack_fffffffffffffdf8] == local_34) ||
             (pIVar8->aiColumn[in_stack_fffffffffffffdf8] == -2)) {
            pcVar6 = "indexed";
          }
        }
      }
      if (pcVar6 != (char *)0x0) {
        sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                      (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        local_40 = sqlite3MPrintf(in_RDI,"cannot open %s column for writing",pcVar6);
        local_38 = 1;
        sqlite3BtreeLeaveAll((sqlite3 *)0x137c4f);
        break;
      }
      in_stack_fffffffffffffe08 = 0;
      in_stack_fffffffffffffe10 = (Incrblob *)0x0;
    }
    pVVar5 = sqlite3VdbeCreate(pParse);
    *(Vdbe **)((long)pvVar4 + 0x18) = pVVar5;
    if (*(long *)((long)pvVar4 + 0x18) != 0) {
      in_stack_fffffffffffffdf0 = *(Vdbe **)((long)pvVar4 + 0x18);
      in_stack_fffffffffffffdec = sqlite3SchemaToIndex(in_RDI,local_48->pSchema);
      sqlite3VdbeAddOp4Int
                (in_stack_fffffffffffffde0,(int)((ulong)pParse >> 0x20),(int)pParse,
                 in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
      iVar3 = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
      sqlite3VdbeChangeP5(in_stack_fffffffffffffdf0,1);
      in_stack_fffffffffffffde0 =
           (Vdbe *)sqlite3VdbeAddOpList
                             ((Vdbe *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                              iVar3,(VdbeOpList *)pParse,in_stack_fffffffffffffdd4);
      iVar3 = (int)((ulong)pParse >> 0x20);
      sqlite3VdbeUsesBtree
                ((Vdbe *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdcc);
      if (in_RDI->mallocFailed == '\0') {
        *(u32 *)((long)&in_stack_fffffffffffffde0->db + 4) = in_stack_fffffffffffffdec;
        *(int *)&in_stack_fffffffffffffde0->pPrev = local_48->tnum;
        *(uint *)((long)&in_stack_fffffffffffffde0->pPrev + 4) = uVar2;
        sqlite3VdbeChangeP4(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                            (char *)in_stack_fffffffffffffde0,iVar3);
      }
      if (in_RDI->mallocFailed == '\0') {
        if (uVar2 != 0) {
          *(undefined1 *)&in_stack_fffffffffffffde0->pParse = 0x6e;
        }
        *(int *)&in_stack_fffffffffffffde0->nVar = local_48->tnum;
        in_stack_fffffffffffffde0->magic = in_stack_fffffffffffffdec;
        *(undefined1 *)((long)&in_stack_fffffffffffffde0->pParse + 1) = 0xfd;
        in_stack_fffffffffffffde0->nMem = local_48->nCol + 1;
        *(int *)&in_stack_fffffffffffffde0->nFkConstraint = (int)local_48->nCol;
        local_1b0 = 1;
        local_1b4 = 1;
        sqlite3VdbeMakeReady
                  (in_stack_fffffffffffffe00,
                   (Parse *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      }
    }
    *(short *)((long)pvVar4 + 8) = (short)local_34;
    *(sqlite3 **)((long)pvVar4 + 0x20) = in_RDI;
    sqlite3BtreeLeaveAll((sqlite3 *)0x137e61);
    if (in_RDI->mallocFailed != '\0') break;
    local_38 = blobSeekToRow(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                             (char **)in_stack_fffffffffffffe00);
    local_30 = local_30 + 1;
    uVar1 = in_stack_fffffffffffffdd4 & 0xffffff;
    if (local_30 < 0x32) {
      uVar1 = CONCAT13(local_38 == 0x11,(int3)in_stack_fffffffffffffdd4);
    }
    in_stack_fffffffffffffdd4 = uVar1;
  } while ((char)(in_stack_fffffffffffffdd4 >> 0x18) != '\0');
  if ((local_38 == 0) && (in_RDI->mallocFailed == '\0')) {
    *in_stack_00000008 = pvVar4;
  }
  else {
    if ((pvVar4 != (void *)0x0) && (*(long *)((long)pvVar4 + 0x18) != 0)) {
      sqlite3VdbeFinalize((Vdbe *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    }
    sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                  (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  }
  pcVar6 = (char *)0x0;
  if (local_40 != (char *)0x0) {
    pcVar6 = "%s";
  }
  sqlite3ErrorWithMsg(in_RDI,(int)(ulong)local_38,pcVar6,local_40);
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  sqlite3ParserReset((Parse *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  iVar3 = sqlite3ApiExit((sqlite3 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0)
  ;
  sqlite3_mutex_leave((sqlite3_mutex *)0x137fc2);
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  do {
    memset(&sParse, 0, sizeof(Parse));
    if( !pBlob ) goto blob_open_out;
    sParse.db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}